

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O2

REF_STATUS ref_facelift_multiscale(REF_GRID ref_grid,REF_DBL target_complexity)

{
  REF_NODE pRVar1;
  REF_FACELIFT ref_facelift;
  REF_CELL pRVar2;
  uint uVar3;
  REF_STATUS RVar4;
  REF_DBL *recon;
  REF_DBL *pRVar5;
  ulong uVar6;
  undefined8 uVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  REF_DBL *pRVar11;
  char *pcVar12;
  REF_NODE pRVar13;
  REF_STATUS ref_private_macro_code_rss;
  long lVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  REF_DBL RVar19;
  ulong uStack_330;
  double local_308;
  int local_2fc;
  REF_DBL local_2f8;
  REF_DBL det;
  REF_NODE local_2d8;
  REF_NODE local_2d0;
  int local_2c4;
  REF_DBL area;
  REF_DBL det_1;
  REF_DBL area_1;
  double local_2a8;
  double dStack_2a0;
  REF_DBL diag_system2 [6];
  REF_DBL s [3];
  REF_DBL r [3];
  REF_DBL n [3];
  REF_DBL r_1 [3];
  REF_DBL diag_system [12];
  REF_DBL combined [6];
  REF_DBL m [6];
  REF_DBL local_e8 [4];
  REF_DBL s_1 [3];
  REF_INT nodes [27];
  
  pRVar1 = ref_grid->node;
  ref_facelift = ref_grid->geom->ref_facelift;
  local_2f8 = target_complexity;
  if (ref_facelift != (REF_FACELIFT)0x0) {
    ref_facelift_free(ref_facelift);
  }
  uVar3 = ref_facelift_attach(ref_grid);
  if (uVar3 != 0) {
    uStack_330 = (ulong)uVar3;
    pcVar12 = "attach";
    uVar7 = 0x58b;
LAB_001cae79:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
           uVar7,"ref_facelift_multiscale",uStack_330,pcVar12);
    return (REF_STATUS)uStack_330;
  }
  uVar3 = pRVar1->max;
  if (-1 < (int)uVar3) {
    pRVar2 = ref_grid->geom->ref_facelift->tri_cell;
    recon = (REF_DBL *)malloc((ulong)uVar3 * 0x30);
    if (recon == (REF_DBL *)0x0) {
      pcVar12 = "malloc metric of REF_DBL NULL";
      uVar7 = 0x591;
    }
    else {
      uVar3 = ref_grid->node->max;
      if ((int)uVar3 < 0) {
        pcVar12 = "malloc hess of REF_DBL negative";
        uVar7 = 0x593;
        goto LAB_001caf9e;
      }
      pRVar5 = (REF_DBL *)malloc((ulong)uVar3 * 0x18);
      if (pRVar5 != (REF_DBL *)0x0) {
        for (uVar6 = 0; ((ulong)uVar3 * 3 & 0xffffffff) != uVar6; uVar6 = uVar6 + 1) {
          pRVar5[uVar6] = 0.0;
        }
        uVar3 = ref_recon_rsn_hess_face(ref_grid,pRVar5);
        if (uVar3 == 0) {
          pRVar11 = pRVar5;
          RVar19 = local_2f8;
          local_2d0 = pRVar1;
          for (lVar14 = 0; pRVar1 = local_2d0, lVar14 < local_2d0->max; lVar14 = lVar14 + 1) {
            if (-1 < local_2d0->global[lVar14]) {
              uVar3 = ref_matrix_det_m2(pRVar5 + lVar14 * 3,&det);
              if (uVar3 != 0) {
                uStack_330 = (ulong)uVar3;
                pcVar12 = "2x2 det";
                uVar7 = 0x596;
                goto LAB_001cae79;
              }
              RVar19 = local_2f8;
              if (0.0 < det) {
                for (lVar9 = 0; RVar19 = local_2f8, lVar9 != 3; lVar9 = lVar9 + 1) {
                  dVar15 = pow(det,-0.16666666666666666);
                  pRVar11[lVar9] = dVar15 * pRVar11[lVar9];
                }
              }
            }
            pRVar11 = pRVar11 + 3;
          }
          pRVar13 = (REF_NODE)0x0;
          dVar15 = 0.0;
          while( true ) {
            if (pRVar2->max <= (int)pRVar13) break;
            RVar4 = ref_cell_nodes(pRVar2,(int)pRVar13,nodes);
            RVar19 = local_2f8;
            if (RVar4 == 0) {
              uVar3 = ref_node_tri_area(pRVar1,nodes,&area);
              if (uVar3 != 0) {
                uStack_330 = (ulong)uVar3;
                pcVar12 = "area";
                uVar7 = 0x59e;
                goto LAB_001cae79;
              }
              RVar19 = local_2f8;
              local_2d8 = pRVar13;
              for (lVar14 = 0; pRVar13 = local_2d8, lVar14 < pRVar2->node_per; lVar14 = lVar14 + 1)
              {
                if (pRVar1->ref_mpi->id == pRVar1->part[nodes[lVar14]]) {
                  uVar3 = ref_matrix_det_m2(pRVar5 + (long)nodes[lVar14] * 3,&det);
                  if (uVar3 != 0) {
                    uStack_330 = (ulong)uVar3;
                    pcVar12 = "2x2 det";
                    uVar7 = 0x5a1;
                    goto LAB_001cae79;
                  }
                  RVar19 = local_2f8;
                  if (0.0 < det) {
                    if (det < 0.0) {
                      dVar16 = sqrt(det);
                    }
                    else {
                      dVar16 = SQRT(det);
                    }
                    dVar15 = dVar15 + (dVar16 * area) / (double)pRVar2->node_per;
                    RVar19 = local_2f8;
                  }
                }
              }
            }
            pRVar13 = (REF_NODE)(ulong)((int)pRVar13 + 1);
          }
          auVar17._0_8_ = dVar15 * 1e+20;
          auVar17._8_8_ = RVar19;
          auVar18._8_8_ = -RVar19;
          auVar18._0_8_ = -auVar17._0_8_;
          auVar18 = maxpd(auVar17,auVar18);
          local_2a8 = auVar18._8_8_;
          dStack_2a0 = local_2a8;
          if (auVar18._0_8_ <= local_2a8) {
            uStack_330 = 4;
            pcVar12 = "zero compelxity";
            uVar7 = 0x5ab;
          }
          else {
            uVar3 = pRVar1->max;
            uVar6 = 0;
            uVar8 = 0;
            pRVar11 = pRVar5;
            if (0 < (int)uVar3) {
              uVar8 = (ulong)uVar3;
            }
            for (; uVar6 != uVar8; uVar6 = uVar6 + 1) {
              if (-1 < pRVar1->global[uVar6]) {
                for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
                  pRVar11[lVar14] = pRVar11[lVar14] * (RVar19 / dVar15);
                }
              }
              pRVar11 = pRVar11 + 3;
            }
            for (lVar14 = 0; lVar14 < (int)uVar3; lVar14 = lVar14 + 1) {
              if (-1 < pRVar1->global[lVar14]) {
                uVar3 = ref_recon_rsn(ref_grid,(REF_INT)lVar14,r,s,n);
                if (uVar3 != 0) {
                  uStack_330 = (ulong)uVar3;
                  pcVar12 = "rsn";
                  uVar7 = 0x5b6;
                  goto LAB_001cae79;
                }
                uVar3 = ref_matrix_diag_m2(pRVar5 + lVar14 * 3,diag_system2);
                if (uVar3 != 0) {
                  uStack_330 = (ulong)uVar3;
                  pcVar12 = "decomp";
                  uVar7 = 0x5b7;
                  goto LAB_001cae79;
                }
                diag_system[0] = diag_system2[0];
                for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
                  diag_system[lVar9 + 3] = r[lVar9] * diag_system2[2] + s[lVar9] * diag_system2[3];
                }
                diag_system[1] = diag_system2[1];
                for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
                  diag_system[lVar9 + 6] = r[lVar9] * diag_system2[4] + s[lVar9] * diag_system2[5];
                }
                for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
                  diag_system[lVar9 + 9] = n[lVar9];
                }
                uVar3 = ref_matrix_form_m(diag_system,recon + lVar14 * 6);
                if (uVar3 != 0) {
                  uStack_330 = (ulong)uVar3;
                  pcVar12 = "form m";
                  uVar7 = 0x5c8;
                  goto LAB_001cae79;
                }
                uVar3 = pRVar1->max;
              }
            }
            free(pRVar5);
            uVar3 = ref_recon_roundoff_limit(recon,ref_grid);
            if (uVar3 == 0) {
              pRVar1 = ref_grid->node;
              uStack_330 = 4;
              local_2fc = 0;
              do {
                pRVar13 = ref_grid->node;
                pRVar2 = ref_grid->cell[3];
                local_308 = 0.0;
                iVar10 = 0;
                local_2d8 = pRVar13;
                while (iVar10 < pRVar2->max) {
                  local_2c4 = iVar10;
                  RVar4 = ref_cell_nodes(pRVar2,iVar10,(REF_INT *)m);
                  if (RVar4 == 0) {
                    uVar3 = ref_node_tri_area(pRVar13,(REF_INT *)m,&area_1);
                    if (uVar3 != 0) {
                      uVar8 = (ulong)uVar3;
                      uVar7 = 0x536;
                      uVar6 = (ulong)uVar3;
                      pcVar12 = "area";
                      goto LAB_001cb769;
                    }
                    for (lVar14 = 0; lVar14 < pRVar2->node_per; lVar14 = lVar14 + 1) {
                      iVar10 = *(int *)((long)m + lVar14 * 4);
                      if (pRVar13->ref_mpi->id == pRVar13->part[iVar10]) {
                        uVar3 = ref_recon_rsn(ref_grid,iVar10,r_1,s_1,local_e8);
                        if (uVar3 != 0) {
                          uVar8 = (ulong)uVar3;
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                                 ,0x539,"ref_facelift_complexity",(ulong)uVar3,"rsn");
                          goto LAB_001cb775;
                        }
                        uVar3 = ref_matrix_extract2(recon + (long)*(int *)((long)m + lVar14 * 4) * 6
                                                    ,r_1,s_1,combined);
                        if (uVar3 != 0) {
                          uVar8 = (ulong)uVar3;
                          uVar7 = 0x53b;
                          uVar6 = (ulong)uVar3;
                          pcVar12 = "extract";
                          goto LAB_001cb769;
                        }
                        uVar3 = ref_matrix_det_m2(combined,&det_1);
                        pRVar13 = local_2d8;
                        if (uVar3 != 0) {
                          uVar8 = (ulong)uVar3;
                          uVar7 = 0x53c;
                          uVar6 = (ulong)uVar3;
                          pcVar12 = "2x2 det";
                          goto LAB_001cb769;
                        }
                        if (0.0 < det_1) {
                          if (det_1 < 0.0) {
                            dVar15 = sqrt(det_1);
                          }
                          else {
                            dVar15 = SQRT(det_1);
                          }
                          local_308 = (dVar15 * area_1) / (double)pRVar2->node_per + local_308;
                        }
                      }
                    }
                  }
                  iVar10 = local_2c4 + 1;
                }
                uVar3 = ref_mpi_allsum(ref_grid->mpi,&local_308,1,3);
                if (uVar3 == 0) {
                  uVar8 = 0;
                }
                else {
                  uVar8 = (ulong)uVar3;
                  uVar7 = 0x545;
                  uVar6 = (ulong)uVar3;
                  pcVar12 = "dbl sum";
LAB_001cb769:
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                         ,uVar7,"ref_facelift_complexity",uVar6,pcVar12);
                }
LAB_001cb775:
                if (local_2fc == 0x14) {
                  if ((int)uVar8 == 0) {
                    dVar15 = local_308 * 1e+20;
                    if (dVar15 <= -dVar15) {
                      dVar15 = -dVar15;
                    }
                    if (local_2a8 < dVar15) {
                      uVar8 = 0;
                      pRVar5 = recon;
                      uVar6 = (ulong)(uint)pRVar1->max;
                      if (pRVar1->max < 1) {
                        uVar6 = uVar8;
                      }
                      for (; uVar8 != uVar6; uVar8 = uVar8 + 1) {
                        if (-1 < pRVar1->global[uVar8]) {
                          for (lVar14 = 0; lVar14 != 6; lVar14 = lVar14 + 1) {
                            pRVar5[lVar14] = pRVar5[lVar14] * (local_2f8 / local_308);
                          }
                        }
                        pRVar5 = pRVar5 + 6;
                      }
                      lVar14 = 0;
                      pRVar5 = recon;
                      do {
                        if (local_2d0->max <= lVar14) {
                          uVar3 = ref_metric_to_node(recon,ref_grid->node);
                          if (uVar3 == 0) {
                            free(recon);
                            return 0;
                          }
                          uStack_330 = (ulong)uVar3;
                          pcVar12 = "to";
                          uVar7 = 0x5ed;
                          goto LAB_001cae79;
                        }
                        if (-1 < local_2d0->global[lVar14]) {
                          uVar3 = ref_node_metric_get(local_2d0,(REF_INT)lVar14,m);
                          if (uVar3 != 0) {
                            uStack_330 = (ulong)uVar3;
                            pcVar12 = "curve metric";
                            uVar7 = 0x5e3;
                            goto LAB_001cae79;
                          }
                          uVar3 = ref_matrix_intersect(recon + lVar14 * 6,m,combined);
                          if (uVar3 != 0) {
                            uStack_330 = (ulong)uVar3;
                            pcVar12 = "intersect";
                            uVar7 = 0x5e4;
                            goto LAB_001cae79;
                          }
                          for (lVar9 = 0; lVar9 != 6; lVar9 = lVar9 + 1) {
                            pRVar5[lVar9] = combined[lVar9];
                          }
                        }
                        lVar14 = lVar14 + 1;
                        pRVar5 = pRVar5 + 6;
                      } while( true );
                    }
                  }
                  else {
                    uVar7 = 0x567;
LAB_001cb8ad:
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                           ,uVar7,"ref_facelift_gradation_at_complexity",uVar8,"cmp");
                    uStack_330 = uVar8;
                  }
                  goto LAB_001cb8ba;
                }
                if ((int)uVar8 != 0) {
                  uVar7 = 0x555;
                  goto LAB_001cb8ad;
                }
                dVar15 = local_308 * 1e+20;
                if (dVar15 <= -dVar15) {
                  dVar15 = -dVar15;
                }
                if (dVar15 <= local_2a8) goto LAB_001cb8ba;
                uVar6 = (ulong)(uint)pRVar1->max;
                if (pRVar1->max < 1) {
                  uVar6 = 0;
                }
                pRVar5 = recon;
                for (uVar8 = 0; uVar8 != uVar6; uVar8 = uVar8 + 1) {
                  if (-1 < pRVar1->global[uVar8]) {
                    for (lVar14 = 0; lVar14 != 6; lVar14 = lVar14 + 1) {
                      pRVar5[lVar14] = pRVar5[lVar14] * (local_2f8 / local_308);
                    }
                  }
                  pRVar5 = pRVar5 + 6;
                }
                uVar3 = ref_metric_mixed_space_gradation(recon,ref_grid,-1.0,-1.0);
                local_2fc = local_2fc + 1;
              } while (uVar3 == 0);
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                     ,0x561,"ref_facelift_gradation_at_complexity",(ulong)uVar3,"gradation");
              uStack_330 = (ulong)uVar3;
LAB_001cb8ba:
              pcVar12 = "gradation at complexity";
              uVar7 = 0x5e0;
            }
            else {
              uStack_330 = (ulong)uVar3;
              pcVar12 = "floor eigs above zero";
              uVar7 = 0x5d3;
            }
          }
        }
        else {
          uStack_330 = (ulong)uVar3;
          pcVar12 = "rsn";
          uVar7 = 0x594;
        }
        goto LAB_001cae79;
      }
      pcVar12 = "malloc hess of REF_DBL NULL";
      uVar7 = 0x593;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
           uVar7,"ref_facelift_multiscale",pcVar12);
    return 2;
  }
  pcVar12 = "malloc metric of REF_DBL negative";
  uVar7 = 0x591;
LAB_001caf9e:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",uVar7,
         "ref_facelift_multiscale",pcVar12);
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_multiscale(REF_GRID ref_grid,
                                           REF_DBL target_complexity) {
  REF_FACELIFT ref_facelift;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_DBL *hess, *metric;
  REF_INT node, i;
  REF_INT dimension = 2, p_norm = 2;
  REF_INT gradation = -1.0;
  REF_DBL det, exponent, complexity, area, complexity_scale;
  REF_DBL diag_system2[6];
  REF_DBL diag_system[12];
  REF_DBL m[6], combined[6];
  REF_DBL r[3], s[3], n[3];
  REF_BOOL verbose = REF_FALSE;
  REF_BOOL steps = REF_FALSE;
  REF_INT cell_node, cell, nodes[REF_CELL_MAX_SIZE_PER];

  /* reset facelift to match grid */
  ref_facelift = ref_geom_facelift(ref_grid_geom(ref_grid));
  if (NULL != ref_facelift) ref_facelift_free(ref_facelift);
  ref_facelift = NULL;
  RSS(ref_facelift_attach(ref_grid), "attach");
  ref_facelift = ref_geom_facelift(ref_grid_geom(ref_grid));
  ref_cell = ref_facelift_tri(ref_facelift);

  exponent = -1.0 / ((REF_DBL)(2 * p_norm + dimension));

  ref_malloc(metric, 6 * ref_node_max(ref_node), REF_DBL);
  ref_malloc_init(hess, 3 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL,
                  0.0);
  RSS(ref_recon_rsn_hess_face(ref_grid, hess), "rsn");
  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_matrix_det_m2(&(hess[3 * node]), &det), "2x2 det");
    if (det > 0.0) { /* local scaling */
      for (i = 0; i < 3; i++) hess[i + 3 * node] *= pow(det, exponent);
    }
  }

  complexity = 0.0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_node_tri_area(ref_node, nodes, &area), "area");
    for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell); cell_node++) {
      if (ref_node_owned(ref_node, nodes[cell_node])) {
        RSS(ref_matrix_det_m2(&(hess[3 * nodes[cell_node]]), &det), "2x2 det");
        if (det > 0.0) {
          complexity +=
              sqrt(det) * area / ((REF_DBL)ref_cell_node_per(ref_cell));
        }
      }
    }
  }

  if (!ref_math_divisible(target_complexity, complexity)) {
    RSS(REF_DIV_ZERO, "zero compelxity");
  }

  complexity_scale = 1.0;
  each_ref_node_valid_node(ref_node, node) { /* global scaling */
    for (i = 0; i < 3; i++)
      hess[i + 3 * node] *=
          pow(target_complexity / complexity, complexity_scale);
  }

  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_recon_rsn(ref_grid, node, r, s, n), "rsn");
    RSS(ref_matrix_diag_m2(&(hess[3 * node]), diag_system2), "decomp");
    ref_matrix_eig(diag_system, 0) = ref_matrix_eig2(diag_system2, 0);
    for (i = 0; i < 3; i++) {
      ref_matrix_vec(diag_system, i, 0) =
          ref_matrix_vec2(diag_system2, 0, 0) * r[i] +
          ref_matrix_vec2(diag_system2, 1, 0) * s[i];
    }
    ref_matrix_eig(diag_system, 1) = ref_matrix_eig2(diag_system2, 1);
    for (i = 0; i < 3; i++) {
      ref_matrix_vec(diag_system, i, 1) =
          ref_matrix_vec2(diag_system2, 0, 1) * r[i] +
          ref_matrix_vec2(diag_system2, 1, 1) * s[i];
    }
    ref_matrix_eig(diag_system, 2) =
        MAX(ref_matrix_eig2(diag_system2, 0), ref_matrix_eig2(diag_system2, 1));
    for (i = 0; i < 3; i++) ref_matrix_vec(diag_system, i, 2) = n[i];

    RSS(ref_matrix_form_m(diag_system, &(metric[6 * node])), "form m");
    if (verbose) {
      ref_matrix_show_diag_sys(diag_system);
      ref_metric_show(&(metric[6 * node]));
      printf("n %f %f %f\n", n[0], n[1], n[2]);
      printf("v %f %f %f\n", diag_system[0 + 9], diag_system[1 + 9],
             diag_system[2 + 9]);
    }
  }
  ref_free(hess);

  RSS(ref_recon_roundoff_limit(metric, ref_grid), "floor eigs above zero");

  if (steps) {
    RSS(ref_metric_to_node(metric,
                           ref_grid_node(ref_facelift_grid(ref_facelift))),
        "to");
    RSS(ref_export_tec_metric_ellipse(ref_facelift_grid(ref_facelift),
                                      "ref_facelift_raw"),
        "al");
  }

  RSS(ref_facelift_gradation_at_complexity(metric, ref_grid, gradation,
                                           target_complexity),
      "gradation at complexity");

  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_node_metric_get(ref_node, node, m), "curve metric");
    RSS(ref_matrix_intersect(&(metric[6 * node]), m, combined), "intersect");
    if (verbose) {
      ref_metric_show(&(metric[6 * node]));
      ref_metric_show(m);
      ref_metric_show(combined);
      printf("\n");
    }
    for (i = 0; i < 6; i++) metric[i + 6 * node] = combined[i];
  }
  RSS(ref_metric_to_node(metric, ref_grid_node(ref_grid)), "to");

  if (steps) {
    RSS(ref_metric_to_node(metric,
                           ref_grid_node(ref_facelift_grid(ref_facelift))),
        "to");
    RSS(ref_export_tec_metric_ellipse(ref_facelift_grid(ref_facelift),
                                      "ref_facelift_grad"),
        "al");
  }

  ref_free(metric);

  return REF_SUCCESS;
}